

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
::copy_elements_from
          (table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
           *this,table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
                 *x)

{
  if ((this->arrays).groups_size_mask == (x->arrays).groups_size_mask) {
    fast_copy_elements_from(this,x);
    return;
  }
  table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,std::shared_ptr<slang::ast::SystemSubroutine>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>const,std::shared_ptr<slang::ast::SystemSubroutine>>>>
  ::
  for_all_elements<boost::unordered::detail::foa::table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,std::shared_ptr<slang::ast::SystemSubroutine>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>const,std::shared_ptr<slang::ast::SystemSubroutine>>>>::copy_elements_from(boost::unordered::detail::foa::table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,std::shared_ptr<slang::ast::SystemSubroutine>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>const,std::shared_ptr<slang::ast::SystemSubroutine>>>>const&)::_lambda(std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>const,std::shared_ptr<slang::ast::SystemSubroutine>>const*)_1_>
            (&x->arrays,(anon_class_8_1_8991fb9c)this);
  return;
}

Assistant:

void copy_elements_from(const table_core& x) {
        BOOST_ASSERT(empty());
        BOOST_ASSERT(this != std::addressof(x));
        if (arrays.groups_size_mask == x.arrays.groups_size_mask) {
            fast_copy_elements_from(x);
        }
        else {
            x.for_all_elements([this](const element_type* p) { unchecked_insert(*p); });
        }
    }